

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O0

_Bool trans_VMOV_imm_dp(DisasContext_conflict1 *s,arg_VMOV_imm_dp *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint64_t val;
  TCGv_i64 var;
  uint local_3c;
  uint32_t vd;
  TCGv_i64 fd;
  int veclen;
  uint32_t delta_d;
  TCGContext_conflict1 *tcg_ctx;
  arg_VMOV_imm_dp *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  fd._4_4_ = 0;
  fd._0_4_ = s->vec_len;
  local_3c = a->vd;
  _Var1 = isar_feature_aa32_fpdp_v3(s->isar);
  if (_Var1) {
    _Var1 = isar_feature_aa32_simd_r32(s->isar);
    if ((_Var1) || ((local_3c & 0x10) == 0)) {
      _Var1 = isar_feature_aa32_fpshvec(s->isar);
      if ((_Var1) || (((int)fd == 0 && (s->vec_stride == 0)))) {
        _Var1 = vfp_access_check(s);
        if (_Var1) {
          if (0 < (int)fd) {
            _Var1 = vfp_dreg_is_scalar(local_3c);
            if (_Var1) {
              fd._0_4_ = 0;
            }
            else {
              fd._4_4_ = (s->vec_stride >> 1) + 1;
            }
          }
          val = vfp_expand_imm_aarch64(3,(uint8_t)a->imm);
          var = tcg_const_i64_aarch64(tcg_ctx_00,val);
          while (neon_store_reg64(tcg_ctx_00,var,local_3c), (int)fd != 0) {
            fd._0_4_ = (int)fd + -1;
            local_3c = vfp_advance_dreg(local_3c,fd._4_4_);
          }
          tcg_temp_free_i64(tcg_ctx_00,var);
          s_local._7_1_ = true;
        }
        else {
          s_local._7_1_ = true;
        }
      }
      else {
        s_local._7_1_ = false;
      }
    }
    else {
      s_local._7_1_ = false;
    }
  }
  else {
    s_local._7_1_ = false;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_VMOV_imm_dp(DisasContext *s, arg_VMOV_imm_dp *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint32_t delta_d = 0;
    int veclen = s->vec_len;
    TCGv_i64 fd;
    uint32_t vd;

    vd = a->vd;

    if (!dc_isar_feature(aa32_fpdp_v3, s)) {
        return false;
    }

    /* UNDEF accesses to D16-D31 if they don't exist. */
    if (!dc_isar_feature(aa32_simd_r32, s) && (vd & 0x10)) {
        return false;
    }

    if (!dc_isar_feature(aa32_fpshvec, s) &&
        (veclen != 0 || s->vec_stride != 0)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    if (veclen > 0) {
        /* Figure out what type of vector operation this is.  */
        if (vfp_dreg_is_scalar(vd)) {
            /* scalar */
            veclen = 0;
        } else {
            delta_d = (s->vec_stride >> 1) + 1;
        }
    }

    fd = tcg_const_i64(tcg_ctx, vfp_expand_imm(MO_64, a->imm));

    for (;;) {
        neon_store_reg64(tcg_ctx, fd, vd);

        if (veclen == 0) {
            break;
        }

        /* Set up the operands for the next iteration */
        veclen--;
        vd = vfp_advance_dreg(vd, delta_d);
    }

    tcg_temp_free_i64(tcg_ctx, fd);
    return true;
}